

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::ProcedureDeclaration::ProcedureDeclaration(ProcedureDeclaration *this)

{
  allocator local_31;
  string local_30 [32];
  ProcedureDeclaration *local_10;
  ProcedureDeclaration *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"ProcedureDeclaration",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<MyCompiler::Ident>::shared_ptr(&this->pIdent);
  std::shared_ptr<MyCompiler::Block>::shared_ptr(&this->pBlock);
  return;
}

Assistant:

MyCompiler::ProcedureDeclaration::ProcedureDeclaration()
        : AbstractAstNode("ProcedureDeclaration")
{}